

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::SelectFlatLoopSwitch<long,long,duckdb::GreaterThanEquals,true,false>
                (long *ldata,long *rdata,SelectionVector *sel,idx_t count,ValidityMask *mask,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  long lVar4;
  long lVar5;
  sel_t *psVar6;
  idx_t iVar7;
  bool bVar8;
  sel_t sVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  unsigned_long uVar16;
  ulong uVar17;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    uVar17 = count + 0x3f;
    if (true_sel == (SelectionVector *)0x0) {
      if (uVar17 < 0x40) {
        lVar10 = 0;
      }
      else {
        puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        lVar10 = 0;
        uVar15 = 0;
        uVar12 = 0;
        do {
          if (puVar1 == (unsigned_long *)0x0) {
            uVar16 = 0xffffffffffffffff;
          }
          else {
            uVar16 = puVar1[uVar15];
          }
          uVar14 = uVar12 + 0x40;
          if (count <= uVar12 + 0x40) {
            uVar14 = count;
          }
          uVar11 = uVar12;
          if (uVar16 == 0xffffffffffffffff) {
            if (uVar12 < uVar14) {
              psVar2 = sel->sel_vector;
              lVar4 = *ldata;
              psVar3 = false_sel->sel_vector;
              do {
                uVar11 = uVar12;
                if (psVar2 != (sel_t *)0x0) {
                  uVar11 = (ulong)psVar2[uVar12];
                }
                lVar5 = rdata[uVar12];
                psVar3[lVar10] = (sel_t)uVar11;
                lVar10 = lVar10 + (ulong)(lVar4 < lVar5);
                uVar12 = uVar12 + 1;
                uVar11 = uVar12;
              } while (uVar14 != uVar12);
            }
          }
          else if (uVar16 == 0) {
            uVar11 = uVar14;
            if (uVar12 < uVar14) {
              psVar2 = sel->sel_vector;
              psVar3 = false_sel->sel_vector;
              do {
                sVar9 = (sel_t)uVar12;
                if (psVar2 != (sel_t *)0x0) {
                  sVar9 = psVar2[uVar12];
                }
                psVar3[lVar10] = sVar9;
                lVar10 = lVar10 + 1;
                uVar12 = uVar12 + 1;
              } while (uVar14 != uVar12);
            }
          }
          else if (uVar12 < uVar14) {
            psVar2 = sel->sel_vector;
            psVar3 = false_sel->sel_vector;
            uVar11 = 0;
            do {
              if (psVar2 == (sel_t *)0x0) {
                sVar9 = (int)uVar12 + (int)uVar11;
              }
              else {
                sVar9 = psVar2[uVar12 + uVar11];
              }
              if ((uVar16 >> (uVar11 & 0x3f) & 1) == 0) {
                uVar13 = 1;
              }
              else {
                uVar13 = (ulong)(*ldata < rdata[uVar12 + uVar11]);
              }
              psVar3[lVar10] = sVar9;
              lVar10 = lVar10 + uVar13;
              uVar11 = uVar11 + 1;
            } while ((uVar12 - uVar14) + uVar11 != 0);
            uVar11 = uVar12 + uVar11;
          }
          uVar15 = uVar15 + 1;
          uVar12 = uVar11;
        } while (uVar15 != uVar17 >> 6);
      }
      return count - lVar10;
    }
    if (0x3f < uVar17) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar7 = 0;
      uVar15 = 0;
      uVar12 = 0;
      do {
        if (puVar1 == (unsigned_long *)0x0) {
          uVar16 = 0xffffffffffffffff;
        }
        else {
          uVar16 = puVar1[uVar15];
        }
        uVar14 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar14 = count;
        }
        uVar11 = uVar14;
        if (uVar16 != 0) {
          uVar11 = uVar12;
          if (uVar16 == 0xffffffffffffffff) {
            if (uVar12 < uVar14) {
              psVar2 = sel->sel_vector;
              lVar10 = *ldata;
              psVar3 = true_sel->sel_vector;
              do {
                uVar12 = uVar11;
                if (psVar2 != (sel_t *)0x0) {
                  uVar12 = (ulong)psVar2[uVar11];
                }
                lVar4 = rdata[uVar11];
                psVar3[iVar7] = (sel_t)uVar12;
                iVar7 = iVar7 + (lVar4 <= lVar10);
                uVar11 = uVar11 + 1;
              } while (uVar14 != uVar11);
            }
          }
          else if (uVar12 < uVar14) {
            psVar2 = sel->sel_vector;
            psVar3 = true_sel->sel_vector;
            uVar11 = 0;
            do {
              if (psVar2 == (sel_t *)0x0) {
                sVar9 = (int)uVar12 + (int)uVar11;
              }
              else {
                sVar9 = psVar2[uVar12 + uVar11];
              }
              if ((uVar16 >> (uVar11 & 0x3f) & 1) == 0) {
                uVar13 = 0;
              }
              else {
                uVar13 = (ulong)(rdata[uVar12 + uVar11] <= *ldata);
              }
              psVar3[iVar7] = sVar9;
              iVar7 = iVar7 + uVar13;
              uVar11 = uVar11 + 1;
            } while ((uVar12 - uVar14) + uVar11 != 0);
            uVar11 = uVar12 + uVar11;
          }
        }
        uVar15 = uVar15 + 1;
        uVar12 = uVar11;
      } while (uVar15 != uVar17 >> 6);
      return iVar7;
    }
  }
  else if (0x3f < count + 0x3f) {
    puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar7 = 0;
    lVar10 = 0;
    uVar12 = 0;
    uVar17 = 0;
    do {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar16 = 0xffffffffffffffff;
      }
      else {
        uVar16 = puVar1[uVar12];
      }
      uVar15 = uVar17 + 0x40;
      if (count <= uVar17 + 0x40) {
        uVar15 = count;
      }
      uVar14 = uVar17;
      if (uVar16 == 0xffffffffffffffff) {
        if (uVar17 < uVar15) {
          psVar2 = sel->sel_vector;
          lVar4 = *ldata;
          psVar3 = true_sel->sel_vector;
          psVar6 = false_sel->sel_vector;
          do {
            uVar14 = uVar17;
            if (psVar2 != (sel_t *)0x0) {
              uVar14 = (ulong)psVar2[uVar17];
            }
            lVar5 = rdata[uVar17];
            psVar3[iVar7] = (sel_t)uVar14;
            iVar7 = iVar7 + (lVar5 <= lVar4);
            psVar6[lVar10] = (sel_t)uVar14;
            lVar10 = lVar10 + (ulong)(lVar4 < lVar5);
            uVar17 = uVar17 + 1;
            uVar14 = uVar17;
          } while (uVar15 != uVar17);
        }
      }
      else if (uVar16 == 0) {
        uVar14 = uVar15;
        if (uVar17 < uVar15) {
          psVar2 = sel->sel_vector;
          psVar3 = false_sel->sel_vector;
          do {
            uVar11 = uVar17;
            if (psVar2 != (sel_t *)0x0) {
              uVar11 = (ulong)psVar2[uVar17];
            }
            psVar3[lVar10] = (sel_t)uVar11;
            lVar10 = lVar10 + 1;
            uVar17 = uVar17 + 1;
          } while (uVar15 != uVar17);
        }
      }
      else if (uVar17 < uVar15) {
        psVar2 = sel->sel_vector;
        psVar3 = true_sel->sel_vector;
        psVar6 = false_sel->sel_vector;
        uVar14 = 0;
        do {
          if (psVar2 == (sel_t *)0x0) {
            sVar9 = (int)uVar17 + (int)uVar14;
          }
          else {
            sVar9 = psVar2[uVar17 + uVar14];
          }
          if ((uVar16 >> (uVar14 & 0x3f) & 1) == 0) {
            bVar8 = false;
          }
          else {
            bVar8 = rdata[uVar17 + uVar14] <= *ldata;
          }
          psVar3[iVar7] = sVar9;
          iVar7 = iVar7 + bVar8;
          psVar6[lVar10] = sVar9;
          lVar10 = lVar10 + (ulong)(bVar8 ^ 1);
          uVar14 = uVar14 + 1;
        } while ((uVar17 - uVar15) + uVar14 != 0);
        uVar14 = uVar17 + uVar14;
      }
      uVar12 = uVar12 + 1;
      uVar17 = uVar14;
    } while (uVar12 != count + 0x3f >> 6);
    return iVar7;
  }
  return 0;
}

Assistant:

static inline idx_t SelectFlatLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                         const SelectionVector *sel, idx_t count, ValidityMask &mask,
	                                         SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else if (true_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, false>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, false, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		}
	}